

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.cpp
# Opt level: O2

int __thiscall CompoundExp::eval(CompoundExp *this,EvalState *state)

{
  string *__lhs;
  _func_int **pp_Var1;
  bool bVar2;
  int iVar3;
  int iVar4;
  allocator local_e9;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  __lhs = &this->op;
  bVar2 = std::operator==(__lhs,"=");
  pp_Var1 = this->lhs->_vptr_Expression;
  if (bVar2) {
    iVar3 = (*pp_Var1[4])();
    if (iVar3 != 1) {
      std::__cxx11::string::string((string *)&local_88,"SYNTAX ERROR",&local_e9);
      error(&local_88);
      std::__cxx11::string::~string((string *)&local_88);
    }
    iVar3 = (*this->rhs->_vptr_Expression[2])(this->rhs,state);
    (*this->lhs->_vptr_Expression[3])(&local_48);
    bVar2 = check_reserve(&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (bVar2) {
      std::__cxx11::string::string((string *)&local_a8,"SYNTAX ERROR",&local_e9);
      error(&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    std::__cxx11::string::string((string *)&local_68,(string *)(this->lhs + 1));
    EvalState::setValue(state,&local_68,iVar3);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    iVar4 = (*pp_Var1[2])(this->lhs,state);
    iVar3 = (*this->rhs->_vptr_Expression[2])(this->rhs,state);
    bVar2 = std::operator==(__lhs,"+");
    if (bVar2) {
      iVar3 = iVar3 + iVar4;
    }
    else {
      bVar2 = std::operator==(__lhs,"-");
      if (bVar2) {
        iVar3 = iVar4 - iVar3;
      }
      else {
        bVar2 = std::operator==(__lhs,"*");
        if (bVar2) {
          iVar3 = iVar3 * iVar4;
        }
        else {
          bVar2 = std::operator==(__lhs,"/");
          if (bVar2) {
            if (iVar3 == 0) {
              std::__cxx11::string::string((string *)&local_c8,"DIVIDE BY ZERO",&local_e9);
              error(&local_c8);
              std::__cxx11::string::~string((string *)&local_c8);
            }
            iVar3 = iVar4 / iVar3;
          }
          else {
            std::__cxx11::string::string((string *)&local_e8,"SYNTAX ERROR",&local_e9);
            error(&local_e8);
            std::__cxx11::string::~string((string *)&local_e8);
            iVar3 = 0;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int CompoundExp::eval(EvalState & state) {
   if (op == "=") {
      if (lhs->getType() != IDENTIFIER) {
         error("SYNTAX ERROR");
      }
      int val = rhs->eval(state);
      if (check_reserve(lhs->toString())) error("SYNTAX ERROR");
      state.setValue(((IdentifierExp *) lhs)->getName(), val);
      return val;
   }
   int left = lhs->eval(state);
   int right = rhs->eval(state);
   if (op == "+") return left + right;
   if (op == "-") return left - right;
   if (op == "*") return left * right;
   if (op == "/") {
       if (right==0) error("DIVIDE BY ZERO");
       return left / right;
   }
   error("SYNTAX ERROR");
   return 0;
}